

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uvectr32.cpp
# Opt level: O1

void __thiscall icu_63::UVector32::removeElementAt(UVector32 *this,int32_t index)

{
  int32_t *piVar1;
  int iVar2;
  
  if (-1 < index) {
    iVar2 = this->count + -1;
    if (index < iVar2) {
      piVar1 = this->elements + (uint)index;
      do {
        *piVar1 = piVar1[1];
        iVar2 = this->count + -1;
        index = index + 1;
        piVar1 = piVar1 + 1;
      } while (index < iVar2);
    }
    this->count = iVar2;
  }
  return;
}

Assistant:

void UVector32::removeElementAt(int32_t index) {
    if (index >= 0) {
        for (int32_t i=index; i<count-1; ++i) {
            elements[i] = elements[i+1];
        }
        --count;
    }
}